

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void visualizeBigSudoku(tuple<SudokuGitter,_SudokuGitter> *bigGitter)

{
  allocator local_101;
  string local_100 [48];
  tuple<SudokuGitter,_SudokuGitter> local_d0;
  undefined1 local_80 [8];
  BigSudokuVisualizer visualizer;
  tuple<SudokuGitter,_SudokuGitter> *bigGitter_local;
  
  visualizer._104_8_ = bigGitter;
  std::tuple<SudokuGitter,_SudokuGitter>::tuple(&local_d0,bigGitter);
  BigSudokuVisualizer::BigSudokuVisualizer((BigSudokuVisualizer *)local_80,&local_d0);
  std::tuple<SudokuGitter,_SudokuGitter>::~tuple(&local_d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"output/big.html",&local_101);
  BigSudokuVisualizer::createHTML((BigSudokuVisualizer *)local_80,(string *)local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  BigSudokuVisualizer::~BigSudokuVisualizer((BigSudokuVisualizer *)local_80);
  return;
}

Assistant:

void visualizeBigSudoku(tuple<SudokuGitter, SudokuGitter> bigGitter){
    BigSudokuVisualizer visualizer = BigSudokuVisualizer(bigGitter);
    visualizer.createHTML("output/big.html");
}